

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O0

int mk_config_listen_read(mk_rconf_section *section,mk_server *server)

{
  int iVar1;
  mk_list *__mptr;
  mk_rconf_entry *entry;
  mk_list *cur;
  int ret;
  mk_server *server_local;
  mk_rconf_section *section_local;
  
  entry = (mk_rconf_entry *)(section->entries).next;
  while( true ) {
    if (entry == (mk_rconf_entry *)&section->entries) {
      return 0;
    }
    iVar1 = strcasecmp((char *)entry[-1]._head.prev,"Listen");
    if ((iVar1 == 0) &&
       (iVar1 = mk_config_listen_parse((char *)entry[-1]._head.next,server), iVar1 != 0)) break;
    entry = (mk_rconf_entry *)entry->val;
  }
  return -1;
}

Assistant:

static int mk_config_listen_read(struct mk_rconf_section *section,
                                 struct mk_server *server)
{
    int ret;
    struct mk_list *cur;
    struct mk_rconf_entry *entry;

    mk_list_foreach(cur, &section->entries) {
        entry = mk_list_entry(cur, struct mk_rconf_entry, _head);
        if (strcasecmp(entry->key, "Listen")) {
            continue;
        }

        ret = mk_config_listen_parse(entry->val, server);
        if (ret != 0) {
            return -1;
        }
    }

    return 0;
}